

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_smax8_mipsel(void *d,void *a,void *b,uint32_t desc)

{
  char cVar1;
  intptr_t oprsz_00;
  int8_t dd;
  int8_t bb;
  long lStack_38;
  int8_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_38 = 0; lStack_38 < oprsz_00; lStack_38 = lStack_38 + 1) {
    cVar1 = *(char *)((long)b + lStack_38);
    if (cVar1 < *(char *)((long)a + lStack_38)) {
      cVar1 = *(char *)((long)a + lStack_38);
    }
    *(char *)((long)d + lStack_38) = cVar1;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_smax8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int8_t)) {
        int8_t aa = *(int8_t *)((char *)a + i);
        int8_t bb = *(int8_t *)((char *)b + i);
        int8_t dd = aa > bb ? aa : bb;
        *(int8_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}